

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_close(PHYSFS_File *_handle)

{
  int local_24;
  int rc;
  FileHandle *handle;
  PHYSFS_File *_handle_local;
  
  __PHYSFS_platformGrabMutex(stateLock);
  local_24 = closeHandleInOpenList(&openReadList,(FileHandle *)_handle);
  if (local_24 == -1) {
    __PHYSFS_platformReleaseMutex(stateLock);
    _handle_local._4_4_ = 0;
  }
  else if ((local_24 == 0) &&
          (local_24 = closeHandleInOpenList(&openWriteList,(FileHandle *)_handle), local_24 == -1))
  {
    __PHYSFS_platformReleaseMutex(stateLock);
    _handle_local._4_4_ = 0;
  }
  else {
    __PHYSFS_platformReleaseMutex(stateLock);
    if (local_24 == 0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
      _handle_local._4_4_ = 0;
    }
    else {
      _handle_local._4_4_ = 1;
    }
  }
  return _handle_local._4_4_;
}

Assistant:

int PHYSFS_close(PHYSFS_File *_handle)
{
    FileHandle *handle = (FileHandle *) _handle;
    int rc;

    __PHYSFS_platformGrabMutex(stateLock);

    /* -1 == close failure. 0 == not found. 1 == success. */
    rc = closeHandleInOpenList(&openReadList, handle);
    BAIL_IF_MUTEX_ERRPASS(rc == -1, stateLock, 0);
    if (!rc)
    {
        rc = closeHandleInOpenList(&openWriteList, handle);
        BAIL_IF_MUTEX_ERRPASS(rc == -1, stateLock, 0);
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);
    BAIL_IF(!rc, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    return 1;
}